

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

bool anon_unknown.dwarf_a9a5e::testMapFilter(void)

{
  bool bVar1;
  int iVar2;
  Value *pVVar3;
  ostream *poVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  Value v;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected;
  allocator_type local_132;
  allocator_type local_131;
  ValueHolder local_130 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  Value local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  Json::Value::Value(&local_80,objectValue);
  Json::Value::Value((Value *)local_130,"Hello");
  pVVar3 = Json::Value::operator[](&local_80,"field1");
  Json::Value::operator=(pVVar3,(Value *)local_130);
  Json::Value::~Value((Value *)local_130);
  Json::Value::Value((Value *)local_130,"world!");
  pVVar3 = Json::Value::operator[](&local_80,"field2");
  Json::Value::operator=(pVVar3,(Value *)local_130);
  Json::Value::~Value((Value *)local_130);
  Json::Value::Value((Value *)local_130,"ignore");
  pVVar3 = Json::Value::operator[](&local_80,"ignore");
  Json::Value::operator=(pVVar3,(Value *)local_130);
  Json::Value::~Value((Value *)local_130);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_130,(char (*) [4])0x7f116a,(char (*) [8])0x7ec19f);
  __l._M_len = 1;
  __l._M_array = (iterator)local_130;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_b0,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_58,&local_132);
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100._M_allocated_capacity + 1);
  }
  if (local_130[0] != &local_120) {
    operator_delete(local_130[0].string_,local_120._M_allocated_capacity + 1);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_130,(char (*) [7])"field1",(char (*) [6])"Hello");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[7],_true>
            (&local_f0,(char (*) [7])"field2",(char (*) [7])"world!");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_130;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_58,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_132,&local_131);
  lVar6 = -0x80;
  paVar5 = &local_f0.second.field_2;
  do {
    if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar5->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],paVar5->_M_allocated_capacity + 1
                     );
    }
    if (&paVar5->_M_allocated_capacity + -4 != (size_type *)(&paVar5->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar5->_M_allocated_capacity)[-6],
                      (&paVar5->_M_allocated_capacity)[-4] + 1);
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar5->_M_allocated_capacity + -8);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0);
  local_130[0].string_ = (char *)&local_80;
  if ((anonymous_namespace)::StringMapFilterHelper_abi_cxx11_._16_8_ == 0) goto LAB_00179758;
  iVar2 = (*(code *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,&local_b0,local_130);
  if (iVar2 == 0) {
    if (local_b0._M_impl.super__Rb_tree_header._M_node_count ==
        local_58._M_impl.super__Rb_tree_header._M_node_count) {
      bVar1 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )local_b0._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )&local_b0._M_impl.super__Rb_tree_header,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )local_58._M_impl.super__Rb_tree_header._M_header._M_left);
      if (bVar1) {
        Json::Value::Value((Value *)local_130,arrayValue);
        Json::Value::operator=(&local_80,(Value *)local_130);
        Json::Value::~Value((Value *)local_130);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_130,(char (*) [4])0x7f116a,(char (*) [8])0x7ec19f);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_b0,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_130,&local_f0);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100._M_allocated_capacity + 1);
        }
        if (local_130[0] != &local_120) {
          operator_delete(local_130[0].string_,local_120._M_allocated_capacity + 1);
        }
        local_130[0].string_ = (char *)&local_80;
        if ((anonymous_namespace)::StringMapFilterHelper_abi_cxx11_._16_8_ == 0) {
LAB_00179758:
          std::__throw_bad_function_call();
        }
        iVar2 = (*(code *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,&local_b0,
                           local_130);
        if (iVar2 == 5) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[4],_const_char_(&)[8],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_130,(char (*) [4])0x7f116a,(char (*) [8])0x7ec19f);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&local_b0,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_130,&local_f0);
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100._M_allocated_capacity + 1);
          }
          if (local_130[0] != &local_120) {
            operator_delete(local_130[0].string_,local_120._M_allocated_capacity + 1);
          }
          local_130[0].int_ = 0;
          if ((anonymous_namespace)::StringMapFilterHelper_abi_cxx11_._16_8_ == 0)
          goto LAB_00179758;
          iVar2 = (*(code *)(anonymous_namespace)::StringMapFilterHelper_abi_cxx11_._24_8_)
                            ((anonymous_namespace)::StringMapFilterHelper_abi_cxx11_,&local_b0,
                             local_130);
          if (iVar2 == 0) {
            if (local_b0._M_impl.super__Rb_tree_header._M_node_count == 0) {
              bVar1 = true;
              goto LAB_001796cb;
            }
            iVar2 = 0x19d;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ASSERT_TRUE(m.empty()) failed on line ",0x26);
          }
          else {
            iVar2 = 0x19c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(StringMapFilterHelper(m, nullptr) == ErrorCode::Success) failed on line "
                       ,0x54);
          }
        }
        else {
          iVar2 = 0x199;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(StringMapFilterHelper(m, &v) == ErrorCode::InvalidObject) failed on line "
                     ,0x55);
        }
        goto LAB_001796a7;
      }
    }
    iVar2 = 0x195;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(m == expected) failed on line ",0x2a);
  }
  else {
    iVar2 = 0x194;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(StringMapFilterHelper(m, &v) == ErrorCode::Success) failed on line ",
               0x4f);
  }
LAB_001796a7:
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  bVar1 = false;
LAB_001796cb:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  Json::Value::~Value(&local_80);
  return bVar1;
}

Assistant:

bool testMapFilter()
{
  Json::Value v(Json::objectValue);
  v["field1"] = "Hello";
  v["field2"] = "world!";
  v["ignore"] = "ignore";

  std::map<std::string, std::string> m{ { "key", "default" } };
  std::map<std::string, std::string> expected{ { "field1", "Hello" },
                                               { "field2", "world!" } };
  ASSERT_TRUE(StringMapFilterHelper(m, &v) == ErrorCode::Success);
  ASSERT_TRUE(m == expected);

  v = Json::arrayValue;
  m = { { "key", "default" } };
  ASSERT_TRUE(StringMapFilterHelper(m, &v) == ErrorCode::InvalidObject);

  m = { { "key", "default" } };
  ASSERT_TRUE(StringMapFilterHelper(m, nullptr) == ErrorCode::Success);
  ASSERT_TRUE(m.empty());

  return true;
}